

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  GetterXsYs<float> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  pIVar12 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar3 = pGVar6->Count;
  lVar15 = (long)(((pGVar6->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar6->Stride;
  fVar16 = *(float *)((long)pGVar6->Xs + lVar15);
  dVar11 = log10((double)*(float *)((long)pGVar6->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  pIVar13 = GImPlot;
  iVar3 = pTVar7->YAxis;
  pIVar8 = pIVar12->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar3].Range.Min;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  lVar15 = (long)(((prim + 1 + pGVar6->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  fVar17 = *(float *)((long)pGVar6->Xs + lVar15);
  IVar2 = pIVar12->PixelRange[iVar3].Min;
  fVar18 = (float)(pIVar12->Mx * ((double)fVar16 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x);
  fVar22 = (float)(pIVar12->My[iVar3] *
                   (((double)(float)(dVar11 / pIVar12->LogDenY[iVar3]) *
                     (pIVar8->YAxis[iVar3].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  dVar11 = log10((double)*(float *)((long)pGVar6->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar3 = pTVar7->YAxis;
  pIVar8 = pIVar13->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar3].Range.Min;
  IVar2 = pIVar13->PixelRange[iVar3].Min;
  fVar16 = (float)(pIVar13->Mx * ((double)fVar17 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x);
  fVar17 = (float)(pIVar13->My[iVar3] *
                   (((double)(float)(dVar11 / pIVar13->LogDenY[iVar3]) *
                     (pIVar8->YAxis[iVar3].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar23 = (this->P12).x;
  fVar24 = (this->P12).y;
  fVar26 = (this->P11).x;
  fVar27 = (this->P11).y;
  fVar19 = fVar22 * fVar26 - fVar18 * fVar27;
  fVar28 = fVar23 * fVar17 - fVar24 * fVar16;
  fVar26 = fVar26 - fVar18;
  fVar23 = fVar23 - fVar16;
  fVar25 = fVar24 - fVar17;
  fVar29 = fVar25 * fVar26 - (fVar27 - fVar22) * fVar23;
  auVar20._0_4_ = fVar19 * fVar23 - fVar28 * fVar26;
  auVar20._4_4_ = fVar19 * fVar25 - fVar28 * (fVar27 - fVar22);
  auVar20._8_4_ = fVar22 * 0.0 - fVar24 * 0.0;
  auVar20._12_4_ = fVar22 * 0.0 - fVar24 * 0.0;
  auVar21._4_4_ = fVar29;
  auVar21._0_4_ = fVar29;
  auVar21._8_4_ = fVar25;
  auVar21._12_4_ = fVar25;
  auVar21 = divps(auVar20,auVar21);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  pIVar9[1].pos.x = fVar18;
  pIVar9[1].pos.y = fVar22;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  pIVar9[2].pos = auVar21._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  IVar2.y = fVar17;
  IVar2.x = fVar16;
  pIVar9[4].pos = IVar2;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  uVar5 = DrawList->_VtxCurrentIdx;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = uVar5;
  uVar14 = -(uint)(fVar22 < fVar17 && fVar24 < fVar27 || fVar17 < fVar22 && fVar27 < fVar24) & 1;
  puVar10[1] = uVar5 + uVar14 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar14 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar18;
  (this->P11).y = fVar22;
  (this->P12).x = fVar16;
  (this->P12).y = fVar17;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }